

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PieceWiseLinearCalib.cpp
# Opt level: O2

CalibrationMap *
tactile::PieceWiseLinearCalib::load(CalibrationMap *__return_storage_ptr__,Node *node)

{
  runtime_error *this;
  
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)NO_YAML_SUPPORT_abi_cxx11_);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PieceWiseLinearCalib::CalibrationMap PieceWiseLinearCalib::load(const YAML::Node &node)
{
#ifdef HAVE_YAML
	CalibrationMap values;
	for (YAML::const_iterator it = node.begin(); it != node.end(); ++it)
		values[it->first.as<float>()] = it->second.as<float>();
	return values;
#else
	throw std::runtime_error(NO_YAML_SUPPORT);
#endif
}